

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_psrldq_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  ZMMReg *pZVar4;
  bool bVar5;
  
  uVar1 = s->_l_ZMMReg[0];
  if (0xf < (int)s->_l_ZMMReg[0]) {
    uVar1 = 0x10;
  }
  uVar3 = (ulong)(0x10 - uVar1);
  pZVar4 = d;
  while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
    pZVar4->_b_ZMMReg[0] = pZVar4->_b_ZMMReg[(int)uVar1];
    pZVar4 = (ZMMReg *)(pZVar4->_b_ZMMReg + 1);
  }
  for (lVar2 = (long)(int)-uVar1 + 0x10; lVar2 < 0x10; lVar2 = lVar2 + 1) {
    d->_b_ZMMReg[lVar2] = '\0';
  }
  return;
}

Assistant:

void glue(helper_psrldq, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift, i;

    shift = s->L(0);
    if (shift > 16) {
        shift = 16;
    }
    for (i = 0; i < 16 - shift; i++) {
        d->B(i) = d->B(i + shift);
    }
    for (i = 16 - shift; i < 16; i++) {
        d->B(i) = 0;
    }
}